

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

bool __thiscall S2Polygon::Contains(S2Polygon *this,S2Polygon *b)

{
  pointer puVar1;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> _Var2;
  bool bVar3;
  pointer *__ptr;
  S1Interval SVar4;
  Options local_48;
  
  bVar3 = S2LatLngRect::Contains(&this->subregion_bound_,&b->bound_);
  if (!bVar3) {
    if (((long)(b->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(b->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) == 8) {
      return false;
    }
    SVar4 = S1Interval::Union(&(this->bound_).lng_,&(b->bound_).lng_);
    if (SVar4.bounds_.c_[0] != -3.141592653589793) {
      return false;
    }
    if (NAN(SVar4.bounds_.c_[0])) {
      return false;
    }
    if (SVar4.bounds_.c_[1] != 3.141592653589793) {
      return false;
    }
    if (NAN(SVar4.bounds_.c_[1])) {
      return false;
    }
  }
  if (((((this->loops_).
         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->loops_).
         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (puVar1 = (b->loops_).
                 super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       ((long)(b->loops_).
              super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 & 0x7fffffff8U) == 8)) &&
      (_Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
       super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
            (puVar1->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,
      *(int *)((long)_Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                     super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0xc) == 1)) &&
     ((*(byte *)((long)_Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                       super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x1a) & 1) != 0)) {
    return false;
  }
  S2BooleanOperation::Options::Options(&local_48);
  bVar3 = S2BooleanOperation::IsEmpty
                    (DIFFERENCE,&(b->index_).super_S2ShapeIndex,&(this->index_).super_S2ShapeIndex,
                     &local_48);
  if (local_48.snap_function_._M_t.
      super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>.
      _M_t.
      super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
      .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>)0x0)
  {
    (**(code **)(*(long *)local_48.snap_function_._M_t.
                          super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
                          .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl + 8)
    )();
    return bVar3;
  }
  return bVar3;
}

Assistant:

bool S2Polygon::Contains(const S2Polygon* b) const {
  // It's worth checking bounding rectangles, since they are precomputed.
  // Note that the first bound has been expanded to account for possible
  // numerical errors in the second bound.
  if (!subregion_bound_.Contains(b->bound_)) {
    // It is possible that A contains B even though Bound(A) does not contain
    // Bound(B).  This can only happen when polygon B has at least two outer
    // shells and the union of the two bounds spans all longitudes.  For
    // example, suppose that B consists of two shells with a longitude gap
    // between them, while A consists of one shell that surrounds both shells
    // of B but goes the other way around the sphere (so that it does not
    // intersect the longitude gap).
    //
    // For convenience we just check whether B has at least two loops rather
    // than two outer shells.
    if (b->num_loops() == 1 || !bound_.lng().Union(b->bound_.lng()).is_full()) {
      return false;
    }
  }

  // The following case is not handled by S2BooleanOperation because it only
  // determines whether the boundary of the result is empty (which does not
  // distinguish between the full and empty polygons).
  if (is_empty() && b->is_full()) return false;

  return S2BooleanOperation::Contains(index_, b->index_);
}